

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDevice.h
# Opt level: O3

void __thiscall
ResourceDeleter<const_AmsNetId>::operator()
          (ResourceDeleter<const_AmsNetId> *this,AmsNetId *resource)

{
  undefined8 uVar1;
  AmsNetId local_10;
  
  local_10.b._0_4_ = *(undefined4 *)resource->b;
  local_10.b._4_2_ = *(undefined2 *)(resource->b + 4);
  if ((this->FreeResource).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->FreeResource)._M_invoker)((_Any_data *)this,&local_10);
    operator_delete(resource);
    return;
  }
  uVar1 = std::__throw_bad_function_call();
  __clang_call_terminate(uVar1);
}

Assistant:

void operator()(T* resource) noexcept
    {
        FreeResource(*resource);
        delete resource;
    }